

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_trap(m68k_info *info)

{
  build_absolute_jump_with_immediate(info,0x160,0,info->ir & 0xf);
  return;
}

Assistant:

static void d68000_trap(m68k_info *info)
{
	build_absolute_jump_with_immediate(info, M68K_INS_TRAP, 0, info->ir&0xf);
}